

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
duckdb::vector<duckdb::FilterPushdownResult,_true>::erase_at
          (vector<duckdb::FilterPushdownResult,_true> *this,idx_t idx)

{
  pointer pFVar1;
  InternalException *this_00;
  pointer pFVar2;
  pointer __src;
  string local_48;
  
  pFVar1 = (this->
           super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
           ).
           super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->
           super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
           ).
           super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (idx <= (ulong)((long)pFVar2 - (long)pFVar1 >> 2)) {
    __src = pFVar1 + idx + 1;
    if (__src != pFVar2) {
      memmove(pFVar1 + idx,__src,(long)pFVar2 - (long)__src);
      pFVar2 = (this->
               super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
               ).
               super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
    ).
    super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar2 + -1;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Can\'t remove offset %d from vector of size %d","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,&local_48,idx,
             (long)(this->
                   super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ).
                   super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->
                   super_vector<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ).
                   super__Vector_base<duckdb::FilterPushdownResult,_std::allocator<duckdb::FilterPushdownResult>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}